

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetRotation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t *psVar1;
  TAngle<double> local_58;
  TAngle<double> local_50;
  int local_44;
  int secnum;
  FSectorTagIterator itr;
  DAngle floor;
  DAngle ceiling;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  TAngle<double>::TAngle(&floor,(double)arg2);
  TAngle<double>::TAngle((TAngle<double> *)&itr,(double)arg1);
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc0,arg0);
  while( true ) {
    local_44 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc0);
    if (local_44 < 0) break;
    psVar1 = sectors + local_44;
    TAngle<double>::TAngle(&local_50,(TAngle<double> *)&itr);
    sector_t::SetAngle(psVar1,0,&local_50);
    psVar1 = sectors + local_44;
    TAngle<double>::TAngle(&local_58,&floor);
    sector_t::SetAngle(psVar1,1,&local_58);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetRotation)
// Sector_SetRotation (tag, floor-angle, ceiling-angle)
{
	DAngle ceiling = (double)arg2;
	DAngle floor = (double)arg1;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetAngle(sector_t::floor, floor);
		sectors[secnum].SetAngle(sector_t::ceiling, ceiling);
	}
	return true;
}